

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alice.cpp
# Opt level: O1

void __thiscall Alice::ObliviousExecute(Alice *this)

{
  long *plVar1;
  pointer pvVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  Message MVar9;
  undefined1 auStack_78 [8];
  Message msg_for_Bob;
  string local_60;
  double local_40;
  double local_38;
  
  if (ObliviousExecute()::fout == '\0') {
    iVar3 = __cxa_guard_acquire(&ObliviousExecute()::fout);
    if (iVar3 != 0) {
      std::ofstream::ofstream(ObliviousExecute()::fout,"../debug/alice/Debug_A.txt",_S_out);
      __cxa_atexit(std::ofstream::~ofstream,ObliviousExecute()::fout,&__dso_handle);
      __cxa_guard_release(&ObliviousExecute()::fout);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ObliviousExecute()::fout,"Alice: Oblivious Execute Run # ",0x1f);
  iVar3 = ObliviousExecute::count;
  ObliviousExecute::count = ObliviousExecute::count + 1;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)ObliviousExecute()::fout,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ObliviousExecute()::fout,"Alice: pc = ",0xc);
  poVar4 = std::ostream::_M_insert<long>(0x10b250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  plVar1 = (this->super_Party).P.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(this->super_Party).pc].
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  auStack_78 = (undefined1  [8])*plVar1;
  msg_for_Bob.scalar1 = plVar1[1];
  Server::Send(this->srv,(Message *)auStack_78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ObliviousExecute()::fout,"Alice: Msg sent to Bob : ",0x19);
  poVar4 = std::ostream::_M_insert<long>(0x10b250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  MVar9 = Server::Receive(this->srv);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ObliviousExecute()::fout,"Alice: Msg rcvd from Bob: ",0x1a);
  poVar4 = std::ostream::_M_insert<long>(0x10b250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  poVar4 = std::ostream::_M_insert<long>((long)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  plVar1 = (this->super_Party).P.
           super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(this->super_Party).pc].
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  uVar8 = MVar9.scalar1 + *plVar1;
  uVar6 = MVar9.scalar2 + plVar1[1];
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)ObliviousExecute()::fout,"Alice: a = ",0xb);
  iVar7 = (int)uVar8;
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)ObliviousExecute()::fout,iVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," b = ",5);
  iVar3 = (int)uVar6;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if (((iVar7 < 0) || (iVar3 < 0)) || (iVar7 == 0 && iVar3 == 0)) {
    (this->super_Party).termination_condition = true;
  }
  else {
    uVar8 = uVar8 & 0x7fffffff;
    pvVar2 = (this->super_Party).D.
             super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar1 = pvVar2[uVar8].super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = *plVar1 - *pvVar2[uVar6 & 0x7fffffff].super__Vector_base<long,_std::allocator<long>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    *plVar1 = lVar5;
    (this->super_Party).output = lVar5;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,">=","");
    lVar5 = ObliviousComparison(this,&local_60,0,
                                *(this->super_Party).D.
                                 super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                                 super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                 super__Vector_impl_data._M_start);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ObliviousExecute()::fout,"Alice: OC output  beta\' = ",0x1a);
    poVar4 = std::ostream::_M_insert<long>(0x10b250);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    local_40 = ObliviousMultiplication
                         (this,lVar5,
                          *(long *)(*(long *)&(this->super_Party).P.
                                              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(this->super_Party).pc].
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ObliviousExecute()::fout,"Alice: OM output beta\'* P\'[pc][2] : ",0x24);
    poVar4 = std::ostream::_M_insert<double>(local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    local_38 = ObliviousMultiplication
                         (this,1 - lVar5,
                          *(long *)(*(long *)&(this->super_Party).P.
                                              super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start
                                              [(this->super_Party).pc].
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data + 0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)ObliviousExecute()::fout,"Alice: OM output (1-beta\')(P\'[pc][3]) : ",0x28
              );
    poVar4 = std::ostream::_M_insert<double>(local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    (this->super_Party).pc = (long)(local_40 + local_38);
  }
  return;
}

Assistant:

void Alice::ObliviousExecute()
{
    static std::ofstream fout("../debug/alice/Debug_A.txt");
    static int count = 0;
    fout<<"Alice: Oblivious Execute Run # "<<count++<<"\n";
    fout<<"Alice: pc = "<<pc<<"\n";
    /*------- Step 1 -------*/
    Message msg_for_Bob, msg_from_Bob;
    msg_for_Bob.scalar1 = P[pc][0];
    msg_for_Bob.scalar2 = P[pc][1];
    srv->Send(msg_for_Bob);
    fout<<"Alice: Msg sent to Bob : "<<msg_for_Bob.scalar1 << " "<<msg_for_Bob.scalar2<<"\n";
    msg_from_Bob = srv->Receive();
    fout<<"Alice: Msg rcvd from Bob: "<<msg_from_Bob.scalar1<<" "<<msg_from_Bob.scalar2<<"\n";
    /*------- Step 2 -------*/
    int a = P[pc][0] + msg_from_Bob.scalar1;
    int b = P[pc][1] + msg_from_Bob.scalar2;
    fout<<"Alice: a = "<<a<<" b = "<<b<<"\n";
    if(a<0 || b<0||(a==0 && b==0)){
        termination_condition = true;
        return;
    }
    /*------- Step 3 -------*/
    D[a][0] = D[a][0] - D[b][0];
    output = D[a][0];
    /*------- Step 4 -------*/
    long beta = ObliviousComparison(">=", 0, D[a][0]);
    fout<<"Alice: OC output  beta' = "<<beta<<"\n";
    /*------- Step 5 -------*/
    double next_pc = ObliviousMultiplication(beta, P[pc][2]);
    fout<< "Alice: OM output beta'* P'[pc][2] : "<<next_pc<<"\n";
    double temp = ObliviousMultiplication(1-beta, P[pc][3]);
    fout<< "Alice: OM output (1-beta')(P'[pc][3]) : "<<temp<<"\n";
    pc = next_pc+temp;    
}